

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * linearize_bool(Proc *proc,AstNode *node,_Bool is_and)

{
  AstNode *expr;
  AstNode *expr_00;
  BasicBlock *false_block;
  BasicBlock *true_block;
  Pseudo *target;
  Pseudo *pPVar1;
  Pseudo *operand2;
  Pseudo *operand1;
  Pseudo *result;
  BasicBlock *end_block;
  BasicBlock *first_block;
  AstNode *e2;
  AstNode *e1;
  _Bool is_and_local;
  AstNode *node_local;
  Proc *proc_local;
  
  expr = (node->field_2).function_stmt.function_expr;
  expr_00 = (node->field_2).binary_expr.expr_right;
  false_block = create_block(proc);
  true_block = create_block(proc);
  target = allocate_temp_pseudo(proc,RAVI_TANY,true);
  pPVar1 = linearize_expression(proc,expr);
  instruct_move(proc,op_mov,target,pPVar1,node->line_number);
  free_temp_pseudo(proc,pPVar1,false);
  if (is_and) {
    instruct_cbr(proc,target,false_block,true_block,node->line_number);
  }
  else {
    instruct_cbr(proc,target,true_block,false_block,node->line_number);
  }
  start_block(proc,false_block,node->line_number);
  pPVar1 = linearize_expression(proc,expr_00);
  instruct_move(proc,op_mov,target,pPVar1,node->line_number);
  free_temp_pseudo(proc,pPVar1,false);
  pPVar1 = allocate_block_pseudo(proc,true_block);
  instruct_br(proc,pPVar1,node->line_number);
  start_block(proc,true_block,node->line_number);
  return target;
}

Assistant:

static Pseudo *linearize_bool(Proc *proc, AstNode *node, bool is_and)
{
	AstNode *e1 = node->binary_expr.expr_left;
	AstNode *e2 = node->binary_expr.expr_right;

	BasicBlock *first_block = create_block(proc);
	BasicBlock *end_block = create_block(proc);

	// leave the result register on top of virtual stack
	Pseudo *result = allocate_temp_pseudo(proc, RAVI_TANY, true);
	Pseudo *operand1 = linearize_expression(proc, e1);
	instruct_move(proc, op_mov, result, operand1, node->line_number);
	free_temp_pseudo(proc, operand1, false);
	if (is_and)
		instruct_cbr(proc, result, first_block, end_block, node->line_number); // If first value is true then evaluate the second
	else
		instruct_cbr(proc, result, end_block, first_block, node->line_number);

	start_block(proc, first_block, node->line_number);
	Pseudo *operand2 = linearize_expression(proc, e2);
	instruct_move(proc, op_mov, result, operand2, node->line_number);
	free_temp_pseudo(proc, operand2, false);
	instruct_br(proc, allocate_block_pseudo(proc, end_block), node->line_number);

	start_block(proc, end_block, node->line_number);
	return result;
}